

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DebugWriter.cpp
# Opt level: O0

void __thiscall
UnifiedRegex::DebugWriter::PrintQuotedString(DebugWriter *this,Char *str,CharCount len)

{
  CharCount len_local;
  Char *str_local;
  DebugWriter *this_local;
  
  CheckForNewline(this);
  if (str == (Char *)0x0) {
    Output::Print(L"null");
  }
  else {
    Output::Print(L"\"");
    PrintEscapedString(this,str,len);
    Output::Print(L"\"");
  }
  return;
}

Assistant:

void DebugWriter::PrintQuotedString(const Char* str, CharCount len)
    {
        CheckForNewline();
        if (str == 0)
            Output::Print(_u("null"));
        else
        {
            Output::Print(_u("\""));
            PrintEscapedString(str, len);
            Output::Print(_u("\""));
        }
    }